

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O1

REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_GLOB *pRVar5;
  REF_DBL *pRVar6;
  long lVar7;
  
  if (ref_cloud->max == ref_cloud->n) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    if (0 < (long)ref_cloud->max) {
      pRVar5 = (REF_GLOB *)realloc(ref_cloud->global,(long)ref_cloud->max << 3);
      ref_cloud->global = pRVar5;
    }
    if (ref_cloud->global == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x85,
             "ref_cloud_push","realloc ref_cloud->global NULL");
      uVar3 = ref_cloud->max;
    }
    else {
      fflush(_stdout);
      uVar3 = ref_cloud->max * ref_cloud->naux;
      if (0 < (int)uVar3) {
        pRVar6 = (REF_DBL *)realloc(ref_cloud->aux,(ulong)uVar3 << 3);
        ref_cloud->aux = pRVar6;
      }
      if (ref_cloud->aux != (REF_DBL *)0x0) goto LAB_001f8dd8;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x87,
             "ref_cloud_push","realloc ref_cloud->aux NULL");
      uVar3 = ref_cloud->max * ref_cloud->naux;
    }
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar3,(long)(int)uVar3,
           8,(long)(int)uVar3 * 8);
    RVar4 = 2;
  }
  else {
LAB_001f8dd8:
    iVar1 = ref_cloud->n;
    ref_cloud->n = iVar1 + 1;
    ref_cloud->global[iVar1] = global;
    iVar2 = ref_cloud->naux;
    if ((long)iVar2 < 1) {
      RVar4 = 0;
    }
    else {
      pRVar6 = ref_cloud->aux;
      RVar4 = 0;
      lVar7 = 0;
      do {
        pRVar6[iVar2 * iVar1 + lVar7] = aux[lVar7];
        lVar7 = lVar7 + 1;
      } while (iVar2 != lVar7);
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud, REF_GLOB global,
                                  REF_DBL *aux) {
  REF_INT item, i;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  /* fill */
  item = ref_cloud_n(ref_cloud);
  ref_cloud_n(ref_cloud)++;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}